

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::anon_unknown_0::ReportReflectionUsageTypeError
               (Descriptor *descriptor,FieldDescriptor *field,char *method,CppType expected_type)

{
  CppType CVar1;
  LogMessage *other;
  FieldDescriptor *in_RSI;
  Descriptor *in_RDI;
  string *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined8 in_stack_ffffffffffffff48;
  LogMessage *in_stack_ffffffffffffff50;
  
  internal::LogMessage::LogMessage
            (in_stack_ffffffffffffff50,(LogLevel)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             (char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
  internal::LogMessage::operator<<
            ((LogMessage *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (char *)in_stack_ffffffffffffff38);
  internal::LogMessage::operator<<
            ((LogMessage *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (char *)in_stack_ffffffffffffff38);
  internal::LogMessage::operator<<
            ((LogMessage *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (char *)in_stack_ffffffffffffff38);
  Descriptor::full_name_abi_cxx11_(in_RDI);
  internal::LogMessage::operator<<
            ((LogMessage *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  internal::LogMessage::operator<<
            ((LogMessage *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (char *)in_stack_ffffffffffffff38);
  FieldDescriptor::full_name_abi_cxx11_(in_RSI);
  internal::LogMessage::operator<<
            ((LogMessage *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff38);
  internal::LogMessage::operator<<
            ((LogMessage *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (char *)in_stack_ffffffffffffff38);
  internal::LogMessage::operator<<
            ((LogMessage *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (char *)in_stack_ffffffffffffff38);
  internal::LogMessage::operator<<
            ((LogMessage *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (char *)in_stack_ffffffffffffff38);
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)0x6d27bb);
  other = internal::LogMessage::operator<<
                    ((LogMessage *)CONCAT44(CVar1,in_stack_ffffffffffffff40),
                     (char *)in_stack_ffffffffffffff38);
  internal::LogFinisher::operator=((LogFinisher *)CONCAT44(CVar1,in_stack_ffffffffffffff40),other);
  internal::LogMessage::~LogMessage((LogMessage *)0x6d27fe);
  return;
}

Assistant:

static void ReportReflectionUsageTypeError(
    const Descriptor* descriptor, const FieldDescriptor* field,
    const char* method, FieldDescriptor::CppType expected_type) {
  GOOGLE_LOG(FATAL)
      << "Protocol Buffer reflection usage error:\n"
         "  Method      : google::protobuf::Reflection::"
      << method
      << "\n"
         "  Message type: "
      << descriptor->full_name()
      << "\n"
         "  Field       : "
      << field->full_name()
      << "\n"
         "  Problem     : Field is not the right type for this message:\n"
         "    Expected  : "
      << cpptype_names_[expected_type]
      << "\n"
         "    Field type: "
      << cpptype_names_[field->cpp_type()];
}